

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visitor_tmpl_impl.hpp
# Opt level: O2

void __thiscall
hiberlite::AVisitor<hiberlite::LoadBean>::~AVisitor(AVisitor<hiberlite::LoadBean> *this)

{
  shared_res<hiberlite::autoclosed_con>::~shared_res(&(this->rootKey).con);
  Scope::~Scope(&this->scope);
  std::deque<hiberlite::Scope,_std::allocator<hiberlite::Scope>_>::~deque(&(this->stack).c);
  return;
}

Assistant:

AVisitor<C>::~AVisitor() {}